

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::BytesToHexString_abi_cxx11_
          (string *__return_storage_ptr__,lts_20250127 *this,string_view from)

{
  size_type sVar1;
  Nullable<const_unsigned_char_*> src;
  undefined1 local_20 [8];
  string_view from_local;
  string *result;
  
  from_local._M_len = from._M_len;
  local_20 = (undefined1  [8])this;
  from_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>
            (__return_storage_ptr__,sVar1 * 2);
  src = (Nullable<const_unsigned_char_*>)
        std::basic_string_view<char,_std::char_traits<char>_>::data
                  ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  (anonymous_namespace)::BytesToHexStringInternal<std::__cxx11::string&>
            (src,__return_storage_ptr__,sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string BytesToHexString(absl::string_view from) {
  std::string result;
  strings_internal::STLStringResizeUninitialized(&result, 2 * from.size());
  absl::BytesToHexStringInternal<std::string&>(
      reinterpret_cast<const unsigned char*>(from.data()), result, from.size());
  return result;
}